

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

bool units::clearEmptySegments(string *unit)

{
  ulong uVar1;
  long lVar2;
  value_type *seg;
  bool bVar3;
  
  lVar2 = 0;
  bVar3 = false;
LAB_001589bc:
  if (lVar2 == 0x80) {
    return bVar3;
  }
  do {
    uVar1 = std::__cxx11::string::find((string *)unit,(long)&Esegs_abi_cxx11_ + lVar2);
    while( true ) {
      if (uVar1 == 0xffffffffffffffff) {
        lVar2 = lVar2 + 0x20;
        goto LAB_001589bc;
      }
      if ((uVar1 != 0) && ((unit->_M_dataplus)._M_p[uVar1 - 1] == '\\')) break;
      std::__cxx11::string::erase((ulong)unit,uVar1);
      uVar1 = std::__cxx11::string::find((string *)unit,(long)&Esegs_abi_cxx11_ + lVar2);
      bVar3 = true;
    }
  } while( true );
}

Assistant:

static bool clearEmptySegments(std::string& unit)
{
    bool changed = false;
    for (const auto& seg : Esegs) {
        auto fnd = unit.find(seg);
        while (fnd != std::string::npos) {
            if (fnd > 0 && unit[fnd - 1] == '\\') {
                fnd = unit.find(seg, fnd + 2);
                continue;
            }
            unit.erase(fnd, seg.size());
            changed = true;
            fnd = unit.find(seg, fnd + 1);
        }
    }
    return changed;
}